

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  TPZFMatrix<double> *this;
  int64_t in_stack_ffffffffffffffd0;
  double dVar3;
  int64_t in_stack_ffffffffffffffd8;
  double dVar4;
  TPZFMatrix<double> *in_stack_ffffffffffffffe0;
  
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  dVar4 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  *pdVar2 = dVar3 * dVar4;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int64_t)dVar3);
  dVar4 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffffe0,(int64_t)dVar4,(int64_t)dVar3);
  dVar1 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffffe0,(int64_t)dVar4,(int64_t)dVar3);
  this = (TPZFMatrix<double> *)(dVar3 * dVar4 + dVar1 * *pdVar2);
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = (double)this;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = *pdVar2 * 4.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = *pdVar2 * 4.0;
  return;
}

Assistant:

void TPZShapeLinear::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		
		phi(2,0) = phi(0,0)*phi(1,0);
		dphi(0,2) = dphi(0,0)*phi(1,0)+phi(0,0)*dphi(0,1);
		
		phi(2,0) *= 4.;
		dphi(0,2) *= 4.;
		
	}